

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderWindow.cpp
# Opt level: O3

void __thiscall sf::RenderWindow::onCreate(RenderWindow *this)

{
  bool bVar1;
  
  bVar1 = priv::RenderTextureImplFBO::isAvailable();
  if (bVar1) {
    (*sf_glad_glGetIntegerv)(0x8ca6,(GLint *)&this->m_defaultFrameBuffer);
  }
  RenderTarget::initialize(&this->super_RenderTarget);
  return;
}

Assistant:

void RenderWindow::onCreate()
{
    if (priv::RenderTextureImplFBO::isAvailable())
    {
        // Retrieve the framebuffer ID we have to bind when targeting the window for rendering
        // We assume that this window's context is still active at this point
        glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, reinterpret_cast<GLint*>(&m_defaultFrameBuffer)));
    }

    // Just initialize the render target part
    RenderTarget::initialize();
}